

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O2

CURLcode pop3_connect(Curl_easy *data,_Bool *done)

{
  unsigned_short *sasl;
  char *pcVar1;
  short sVar2;
  connectdata *conn;
  char cVar3;
  int iVar4;
  CURLcode CVar5;
  CURLcode CVar6;
  char *value;
  uchar uVar7;
  char *first;
  char *pcVar8;
  size_t len;
  bool bVar9;
  
  conn = data->conn;
  *done = false;
  CVar6 = CURLE_OK;
  Curl_conncontrol(conn,0);
  (conn->proto).smbc.send_buf = (char *)0x1d4c0;
  (conn->proto).ftpc.pp.statemachine = pop3_statemachine;
  (conn->proto).ftpc.pp.endofresp = pop3_endofresp;
  (conn->proto).pop3c.preftype = '\a';
  sasl = &(conn->proto).imapc.sasl.authmechs;
  Curl_sasl_init((SASL *)sasl,data,&saslpop3);
  Curl_pp_init(&(conn->proto).ftpc.pp);
  first = conn->options;
  while( true ) {
    bVar9 = CVar6 == CURLE_OK;
    if ((!bVar9) || (first == (char *)0x0)) goto LAB_00148cb5;
    cVar3 = *first;
    pcVar8 = first;
    if (cVar3 == '\0') break;
    while ((value = pcVar8 + 1, cVar3 != '\0' && (cVar3 != '='))) {
      pcVar8 = value;
      cVar3 = *value;
    }
    len = 0xffffffffffffffff;
    while ((cVar3 != '\0' && (cVar3 != ';'))) {
      pcVar1 = pcVar8 + 1;
      pcVar8 = pcVar8 + 1;
      len = len + 1;
      cVar3 = *pcVar1;
    }
    iVar4 = curl_strnequal(first,"AUTH=",5);
    CVar6 = CURLE_URL_MALFORMAT;
    if (iVar4 != 0) {
      CVar5 = Curl_sasl_parse_url_auth_option((SASL *)sasl,value,len);
      CVar6 = CURLE_OK;
      if ((CVar5 != CURLE_OK) &&
         (iVar4 = curl_strnequal(value,"+APOP",len), CVar6 = CVar5, iVar4 != 0)) {
        (conn->proto).pop3c.preftype = '\x02';
        *(undefined2 *)((long)&conn->proto + 0xda) = 0;
        CVar6 = CURLE_OK;
      }
    }
    first = pcVar8 + (*pcVar8 == ';');
  }
  bVar9 = true;
LAB_00148cb5:
  if ((conn->proto).pop3c.preftype != '\x02') {
    sVar2 = *(short *)((long)&conn->proto + 0xda);
    uVar7 = '\0';
    if (sVar2 != 0) {
      uVar7 = (sVar2 == -0x21) * '\x03' + '\x04';
    }
    (conn->proto).pop3c.preftype = uVar7;
  }
  if (!bVar9) {
    return CVar6;
  }
  (data->conn->proto).pop3c.state = POP3_SERVERGREET;
  CVar6 = pop3_multi_statemach(data,done);
  return CVar6;
}

Assistant:

static CURLcode pop3_connect(struct Curl_easy *data, bool *done)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct pop3_conn *pop3c = &conn->proto.pop3c;
  struct pingpong *pp = &pop3c->pp;

  *done = FALSE; /* default to not done yet */

  /* We always support persistent connections in POP3 */
  connkeep(conn, "POP3 default");

  PINGPONG_SETUP(pp, pop3_statemachine, pop3_endofresp);

  /* Set the default preferred authentication type and mechanism */
  pop3c->preftype = POP3_TYPE_ANY;
  Curl_sasl_init(&pop3c->sasl, data, &saslpop3);

  /* Initialise the pingpong layer */
  Curl_pp_init(pp);

  /* Parse the URL options */
  result = pop3_parse_url_options(conn);
  if(result)
    return result;

  /* Start off waiting for the server greeting response */
  pop3_state(data, POP3_SERVERGREET);

  result = pop3_multi_statemach(data, done);

  return result;
}